

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalLimit::Sink
          (PhysicalLimit *this,ExecutionContext *context,DataChunk *chunk,OperatorSinkInput *input)

{
  LocalSinkState *pLVar1;
  bool bVar2;
  idx_t in_RAX;
  ulong uVar3;
  idx_t batch_index;
  _func_int **pp_Var4;
  bool bVar5;
  idx_t max_element;
  
  pLVar1 = input->local_state;
  max_element = in_RAX;
  bVar2 = ComputeOffset(context,chunk,&pLVar1[1].partition_info.batch_index,
                        &pLVar1[1].partition_info.min_batch_index,
                        (idx_t)pLVar1[1]._vptr_LocalSinkState,&max_element,&this->limit_val,
                        &this->offset_val);
  bVar5 = true;
  if (bVar2) {
    uVar3 = max_element - (long)pLVar1[1]._vptr_LocalSinkState;
    if (uVar3 < chunk->count) {
      chunk->count = uVar3;
    }
    batch_index = optional_idx::GetIndex(&(pLVar1->partition_info).batch_index);
    BatchedDataCollection::Append
              ((BatchedDataCollection *)&pLVar1[1].partition_info.partition_data,chunk,batch_index);
    pp_Var4 = (_func_int **)((long)pLVar1[1]._vptr_LocalSinkState + chunk->count);
    pLVar1[1]._vptr_LocalSinkState = pp_Var4;
    bVar5 = pp_Var4 == (_func_int **)max_element;
  }
  return bVar5;
}

Assistant:

SinkResultType PhysicalLimit::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {

	D_ASSERT(chunk.size() > 0);
	auto &state = input.local_state.Cast<LimitLocalState>();
	auto &limit = state.limit;
	auto &offset = state.offset;

	idx_t max_element;
	if (!ComputeOffset(context, chunk, limit, offset, state.current_offset, max_element, limit_val, offset_val)) {
		return SinkResultType::FINISHED;
	}
	auto max_cardinality = max_element - state.current_offset;
	if (max_cardinality < chunk.size()) {
		chunk.SetCardinality(max_cardinality);
	}
	state.data.Append(chunk, state.partition_info.batch_index.GetIndex());
	state.current_offset += chunk.size();
	if (state.current_offset == max_element) {
		return SinkResultType::FINISHED;
	}
	return SinkResultType::NEED_MORE_INPUT;
}